

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::trimr(basic_substring<const_char> *this,char c)

{
  char *pcVar1;
  code *pcVar2;
  bool bVar3;
  error_flags eVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  basic_substring<const_char> bVar8;
  basic_substring<const_char> local_28;
  
  pcVar5 = (char *)this->len;
  pcVar7 = pcVar5;
  if (this->str != (char *)0x0 && pcVar5 != (char *)0x0) {
    do {
      pcVar6 = pcVar7 + -1;
      if (pcVar7 == (char *)0x0) {
        pcVar6 = (char *)0x0;
        pcVar7 = (char *)0xffffffffffffffff;
        break;
      }
      pcVar1 = pcVar7 + (long)(this->str + -1);
      pcVar7 = pcVar6;
    } while (*pcVar1 == c);
    if (pcVar7 != (char *)0xffffffffffffffff) {
      pcVar6 = pcVar7 + 1;
      if (pcVar6 != (char *)0xffffffffffffffff && pcVar5 <= pcVar7) {
        eVar4 = get_error_flags();
        if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
          pcVar2 = (code *)swi(3);
          bVar8 = (basic_substring<const_char>)(*pcVar2)();
          return bVar8;
        }
        handle_error(0x250c0a,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x153b,"(num >= 0 && num <= len) || (num == npos)");
      }
      if (pcVar6 == (char *)0xffffffffffffffff) {
        pcVar6 = (char *)this->len;
      }
      if ((char *)this->len < pcVar6) {
        eVar4 = get_error_flags();
        if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
          pcVar2 = (code *)swi(3);
          bVar8 = (basic_substring<const_char>)(*pcVar2)();
          return bVar8;
        }
        handle_error(0x250c0a,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x153d,"(first >= 0 && first + rnum <= len) || (num == 0)");
      }
      basic_substring(&local_28,this->str,(size_t)pcVar6);
      pcVar5 = local_28.str;
      pcVar6 = (char *)local_28.len;
    }
    if (pcVar7 != (char *)0xffffffffffffffff) goto LAB_001e0377;
  }
  pcVar5 = this->str;
  pcVar6 = (char *)0x0;
LAB_001e0377:
  bVar8.len = (size_t)pcVar6;
  bVar8.str = pcVar5;
  return bVar8;
}

Assistant:

basic_substring trimr(const C c) const
    {
        if( ! empty())
        {
            size_t pos = last_not_of(c, npos);
            if(pos != npos)
                return sub(0, pos+1);
        }
        return sub(0, 0);
    }